

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O2

vector<User,_std::allocator<User>_> * __thiscall
Database::getAllUsers(vector<User,_std::allocator<User>_> *__return_storage_ptr__,Database *this)

{
  int iVar1;
  DatabaseException *this_00;
  allocator local_89;
  char *errorMsg;
  string error;
  string query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  errorMsg = (char *)0x0;
  (__return_storage_ptr__->super__Vector_base<User,_std::allocator<User>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<User,_std::allocator<User>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<User,_std::allocator<User>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&query,"select * from users;",(allocator *)&error);
  iVar1 = sqlite3_exec(this->database,query._M_dataplus._M_p,add_user_callback,
                       __return_storage_ptr__,&errorMsg);
  if (iVar1 == 0) {
    std::__cxx11::string::~string((string *)&query);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&error,errorMsg,&local_89);
  sqlite3_free(errorMsg);
  this_00 = (DatabaseException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_40,"Error while getting all users: ",&error);
  DatabaseException::DatabaseException(this_00,&local_40);
  __cxa_throw(this_00,&DatabaseException::typeinfo,DatabaseException::~DatabaseException);
}

Assistant:

std::vector<User> Database::getAllUsers()
{
	char* errorMsg = nullptr;
	std::vector<User> result;
	std::string query = "select * from users;";

	int retval = sqlite3_exec(database, query.c_str(), add_user_callback, &result, &errorMsg);

	if(retval != SQLITE_OK)
	{
		std::string error(errorMsg);
		sqlite3_free(errorMsg);
		throw DatabaseException("Error while getting all users: " + error);
	}
	else
	{
		return result;
	}
}